

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::bootstrap_pod_type<long_double>(string *name,ModulePtr *m)

{
  Type_Info ti;
  element_type *m_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  ModulePtr MVar1;
  Module *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  element_type *__lhs;
  string *type;
  string local_e0 [80];
  string local_90 [64];
  string local_50;
  string *local_30;
  Module *pMStack_28;
  Proxy_Function *local_20;
  string *local_10;
  
  __lhs = in_RDI;
  local_10 = in_RSI;
  m_00 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x35c4ae);
  user_type<long_double>();
  type = &local_50;
  std::__cxx11::string::string((string *)type,local_10);
  ti.m_bare_type_info = (type_info *)in_stack_fffffffffffffed8;
  ti.m_type_info = (type_info *)in_stack_fffffffffffffed0;
  ti._16_8_ = in_stack_fffffffffffffee0;
  Module::add(pMStack_28,ti,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35c51c);
  constructor<long_double()>();
  std::__cxx11::string::string(local_90,local_10);
  Module::add(in_stack_fffffffffffffed0,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_90);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35c57b);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  construct_pod<long_double>(type,(ModulePtr *)m_00);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x35c5c5);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x35c5d2);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35c5dc);
  fun<long_double,std::__cxx11::string_const&>
            ((_func_longdouble_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)local_20);
  std::operator+((char *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  Module::add(in_stack_fffffffffffffed0,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_e0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35c640);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __lhs;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr bootstrap_pod_type(const std::string &name, ModulePtr m = std::make_shared<Module>())
    {
      m->add(user_type<T>(), name);
      m->add(constructor<T()>(), name);
      construct_pod<T>(name, m);

      m->add(fun(&parse_string<T>), "to_" + name);
      return m;
    }